

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

shared_ptr<chrono::ChPhysicsItem> __thiscall chrono::ChAssembly::Search(ChAssembly *this,char *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chrono::ChBody> sVar2;
  shared_ptr<chrono::ChShaft> sVar3;
  shared_ptr<chrono::ChLinkBase> sVar4;
  shared_ptr<chrono::fea::ChMesh> sVar5;
  shared_ptr<chrono::ChPhysicsItem> sVar6;
  _func_int **local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  sVar2 = ChContainerSearchFromName<std::shared_ptr<chrono::ChBody>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChBody>*,std::vector<std::shared_ptr<chrono::ChBody>,std::allocator<std::shared_ptr<chrono::ChBody>>>>>
                    ((chrono *)&local_30,in_RDX,*(shared_ptr<chrono::ChBody> **)(name + 0x78),
                     *(shared_ptr<chrono::ChBody> **)(name + 0x80));
  _Var1 = sVar2.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_30 == (_func_int **)0x0) {
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    sVar3 = ChContainerSearchFromName<std::shared_ptr<chrono::ChShaft>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChShaft>*,std::vector<std::shared_ptr<chrono::ChShaft>,std::allocator<std::shared_ptr<chrono::ChShaft>>>>>
                      ((chrono *)&local_30,in_RDX,*(shared_ptr<chrono::ChShaft> **)(name + 0x90),
                       *(shared_ptr<chrono::ChShaft> **)(name + 0x98));
    _Var1 = sVar3.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_30 == (_func_int **)0x0) {
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      sVar4 = ChContainerSearchFromName<std::shared_ptr<chrono::ChLinkBase>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChLinkBase>*,std::vector<std::shared_ptr<chrono::ChLinkBase>,std::allocator<std::shared_ptr<chrono::ChLinkBase>>>>>
                        ((chrono *)&local_30,in_RDX,
                         *(shared_ptr<chrono::ChLinkBase> **)(name + 0xa8),
                         *(shared_ptr<chrono::ChLinkBase> **)(name + 0xb0));
      _Var1 = sVar4.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      if (local_30 == (_func_int **)0x0) {
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
        }
        sVar5 = ChContainerSearchFromName<std::shared_ptr<chrono::fea::ChMesh>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::fea::ChMesh>*,std::vector<std::shared_ptr<chrono::fea::ChMesh>,std::allocator<std::shared_ptr<chrono::fea::ChMesh>>>>>
                          ((chrono *)&local_30,in_RDX,
                           *(shared_ptr<chrono::fea::ChMesh> **)(name + 0xc0),
                           *(shared_ptr<chrono::fea::ChMesh> **)(name + 200));
        _Var1 = sVar5.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_30 == (_func_int **)0x0) {
          if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
          }
          sVar6 = ChContainerSearchFromName<std::shared_ptr<chrono::ChPhysicsItem>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChPhysicsItem>*,std::vector<std::shared_ptr<chrono::ChPhysicsItem>,std::allocator<std::shared_ptr<chrono::ChPhysicsItem>>>>>
                            ((chrono *)this,in_RDX,
                             *(shared_ptr<chrono::ChPhysicsItem> **)(name + 0xd8),
                             *(shared_ptr<chrono::ChPhysicsItem> **)(name + 0xe0));
          _Var1 = sVar6.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if ((this->super_ChPhysicsItem).super_ChObj._vptr_ChObj == (_func_int **)0x0) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (this->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              _Var1._M_pi = extraout_RDX;
            }
            (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)0x0;
            (this->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p = (pointer)0x0;
          }
          goto LAB_0054300c;
        }
      }
    }
  }
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = local_30;
  (this->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p = (pointer)local_28;
LAB_0054300c:
  sVar6.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar6.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ChPhysicsItem;
  return (shared_ptr<chrono::ChPhysicsItem>)
         sVar6.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChPhysicsItem> ChAssembly::Search(const char* name) {
    if (auto mbo = SearchBody(name))
        return mbo;

    if (auto msh = SearchShaft(name))
        return msh;

    if (auto mli = SearchLink(name))
        return mli;

    if (auto mesh = SearchMesh(name))
        return mesh;

    if (auto mph = SearchOtherPhysicsItem(name))
        return mph;

    return std::shared_ptr<ChPhysicsItem>();  // not found; return an empty shared_ptr
}